

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arun.cpp
# Opt level: O0

rotation_t * opengv::math::arun(MatrixXd *Hcross)

{
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *in_RDI;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *this;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>
  PVar1;
  Matrix3d V_prime;
  Matrix3d U;
  Matrix3d V;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVDcross;
  rotation_t *R;
  DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
  *in_stack_fffffffffffffaf8;
  RhsNested in_stack_fffffffffffffb00;
  LhsNested in_stack_fffffffffffffb08;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffffb10;
  undefined8 in_stack_fffffffffffffb30;
  MatrixType *in_stack_fffffffffffffb38;
  
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (in_RDI,in_stack_fffffffffffffb38,(uint)((ulong)in_stack_fffffffffffffb30 >> 0x20));
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixV
            ((SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_> *)
             in_stack_fffffffffffffb00.m_matrix);
  Eigen::Matrix<double,3,3,0,3,3>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (in_stack_fffffffffffffb00.m_matrix,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffaf8);
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixU
            ((SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_> *)
             in_stack_fffffffffffffb00.m_matrix);
  Eigen::Matrix<double,3,3,0,3,3>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (in_stack_fffffffffffffb00.m_matrix,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffaf8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffaf8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffb00.m_matrix
             ,(MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
              in_stack_fffffffffffffaf8);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>>
            (in_stack_fffffffffffffb00.m_matrix,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
              *)in_stack_fffffffffffffaf8);
  this = (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
         Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::determinant
                   ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0xaccd6a);
  PVar1.m_rhs.m_matrix = in_stack_fffffffffffffb00.m_matrix;
  PVar1.m_lhs = in_stack_fffffffffffffb08;
  if ((double)this < 0.0) {
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0xaccd93);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (in_stack_fffffffffffffb10,(Index)in_stack_fffffffffffffb08);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (in_stack_fffffffffffffb10,(Index)in_stack_fffffffffffffb08);
    Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>::operator=
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
               in_stack_fffffffffffffb00.m_matrix,
               (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)in_stack_fffffffffffffaf8)
    ;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (in_stack_fffffffffffffb10,(Index)in_stack_fffffffffffffb08);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (in_stack_fffffffffffffb10,(Index)in_stack_fffffffffffffb08);
    Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>::operator=
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
               in_stack_fffffffffffffb00.m_matrix,
               (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)in_stack_fffffffffffffaf8)
    ;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (in_stack_fffffffffffffb10,(Index)in_stack_fffffffffffffb08);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::operator-
              (this);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (in_stack_fffffffffffffb10,(Index)in_stack_fffffffffffffb08);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
               in_stack_fffffffffffffb00.m_matrix,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
                *)in_stack_fffffffffffffaf8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffaf8);
    PVar1 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                       in_stack_fffffffffffffb00.m_matrix,
                       (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                       in_stack_fffffffffffffaf8);
    Eigen::Matrix<double,3,3,0,3,3>::operator=
              (PVar1.m_rhs.m_matrix.m_matrix,in_stack_fffffffffffffaf8);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)PVar1.m_rhs.m_matrix.m_matrix
            );
  return (rotation_t *)in_RDI;
}

Assistant:

opengv::rotation_t
opengv::math::arun( const Eigen::MatrixXd & Hcross )
{
  //decompose matrix H to obtain rotation
  Eigen::JacobiSVD< Eigen::MatrixXd > SVDcross(
      Hcross,
      Eigen::ComputeFullU | Eigen::ComputeFullV );

  Eigen::Matrix3d V = SVDcross.matrixV();
  Eigen::Matrix3d U = SVDcross.matrixU();
  rotation_t R = V * U.transpose();

  //modify the result in case the rotation has determinant=-1
  if( R.determinant() < 0 )
  {
    Eigen::Matrix3d V_prime;
    V_prime.col(0) = V.col(0);
    V_prime.col(1) = V.col(1);
    V_prime.col(2) = -V.col(2);
    R = V_prime * U.transpose();
  }

  return R;
}